

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_if(Parser *psr)

{
  undefined4 head_idx;
  BcIns ins;
  int to_add;
  Function *pFVar1;
  Node NVar2;
  int false_case;
  int jmp_idx;
  int true_case;
  Node condition;
  int jmp_head;
  Parser *psr_local;
  
  condition.field_1.jmp.false_list = -1;
  do {
    lex_next(&psr->lxr);
    NVar2 = parse_expr(psr);
    condition._0_8_ = NVar2.field_1;
    jmp_idx = NVar2.type;
    expr_to_jmp(psr,(Node *)&jmp_idx);
    jmp_ensure_true_falls_through(psr,(Node *)&jmp_idx);
    pFVar1 = psr_fn(psr);
    jmp_list_patch(psr,condition.type,pFVar1->ins_count);
    lex_expect(&psr->lxr,0x7b);
    lex_next(&psr->lxr);
    parse_block(psr);
    lex_expect(&psr->lxr,0x7d);
    lex_next(&psr->lxr);
    if (((psr->lxr).tk.type == 0x10f) || ((psr->lxr).tk.type == 0x10e)) {
      pFVar1 = psr_fn(psr);
      ins = bc_new1(BC_JMP,0);
      to_add = fn_emit(pFVar1,ins);
      jmp_list_append(psr,&condition.field_1.jmp.false_list,to_add);
    }
    pFVar1 = psr_fn(psr);
    jmp_list_patch(psr,condition._4_4_,pFVar1->ins_count);
  } while ((psr->lxr).tk.type == 0x10f);
  if ((psr->lxr).tk.type == 0x10e) {
    lex_next(&psr->lxr);
    lex_expect(&psr->lxr,0x7b);
    lex_next(&psr->lxr);
    parse_block(psr);
    lex_expect(&psr->lxr,0x7d);
    lex_next(&psr->lxr);
  }
  head_idx = condition.field_1.jmp.false_list;
  pFVar1 = psr_fn(psr);
  jmp_list_patch(psr,head_idx,pFVar1->ins_count);
  return;
}

Assistant:

static void parse_if(Parser *psr) {
	// Keep parsing if/elseif statements
	int jmp_head = -1;
	do {
		// Skip the if/elseif token
		lex_next(&psr->lxr);

		// Parse the condition
		Node condition = parse_expr(psr);
		expr_to_jmp(psr, &condition);
		jmp_ensure_true_falls_through(psr, &condition);

		// Patch the condition's true case
		int true_case = psr_fn(psr)->ins_count;
		jmp_list_patch(psr, condition.jmp.true_list, true_case);

		// Parse the contents of the if/elseif
		lex_expect(&psr->lxr, '{');
		lex_next(&psr->lxr);
		parse_block(psr);
		lex_expect(&psr->lxr, '}');
		lex_next(&psr->lxr);

		// If there's another one following
		if (psr->lxr.tk.type == TK_ELSEIF || psr->lxr.tk.type == TK_ELSE) {
			// Add a jump to the end of the if/elseif body
			int jmp_idx = fn_emit(psr_fn(psr), bc_new1(BC_JMP, 0));

			// Add the jump to the jump list, which will get patched to after
			// ALL the if/elseif/else code once we're done
			jmp_list_append(psr, &jmp_head, jmp_idx);
		}

		// Patch the if/elseif's false case here
		int false_case = psr_fn(psr)->ins_count;
		jmp_list_patch(psr, condition.jmp.false_list, false_case);
	} while (psr->lxr.tk.type == TK_ELSEIF);

	// Check for a following `else` statement
	if (psr->lxr.tk.type == TK_ELSE) {
		// Skip the `else` token
		lex_next(&psr->lxr);

		// Parse the contents of the `else`
		lex_expect(&psr->lxr, '{');
		lex_next(&psr->lxr);
		parse_block(psr);
		lex_expect(&psr->lxr, '}');
		lex_next(&psr->lxr);
	}

	// Patch all the jumps at the end of if/elseif bodies here
	jmp_list_patch(psr, jmp_head, psr_fn(psr)->ins_count);
}